

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.h
# Opt level: O0

void __thiscall
nrg::Executor<nrg::AsyncExecutor<nrg::PrioExecution>_>::Executor
          (Executor<nrg::AsyncExecutor<nrg::PrioExecution>_> *this,ExceptionHandler *onError)

{
  function<void_(const_std::exception_&)> local_38;
  ExceptionHandler *local_18;
  ExceptionHandler *onError_local;
  Executor<nrg::AsyncExecutor<nrg::PrioExecution>_> *this_local;
  
  local_18 = onError;
  onError_local = (ExceptionHandler *)this;
  std::function<void_(const_std::exception_&)>::function(&local_38,onError);
  AsyncExecutor<nrg::PrioExecution>::AsyncExecutor(&this->executor_,&local_38);
  std::function<void_(const_std::exception_&)>::~function(&local_38);
  return;
}

Assistant:

Executor(typename ExecutorPolicy::ExceptionHandler onError)
        : executor_(std::move(onError))
    {}